

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O2

void __thiscall
llm_tokenizer_ugm_session::normalize
          (llm_tokenizer_ugm_session *this,string *input,string *normalized)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  _Tuple_impl<0UL,_llama_vocab::impl_*,_std::default_delete<llama_vocab::impl>_> _Var4;
  ulong uVar5;
  bool bVar6;
  byte bVar7;
  ulong input_offset;
  byte bVar8;
  size_t i;
  ulong uVar9;
  string space;
  normalization_result norm_res;
  string local_68 [32];
  normalization_result local_48;
  
  normalized->_M_string_length = 0;
  *(normalized->_M_dataplus)._M_p = '\0';
  std::__cxx11::string::reserve((ulong)normalized);
  if (*(char *)((long)(this->vocab->pimpl)._M_t.
                      super___uniq_ptr_impl<llama_vocab::impl,_std::default_delete<llama_vocab::impl>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_llama_vocab::impl_*,_std::default_delete<llama_vocab::impl>_>
                      .super__Head_base<0UL,_llama_vocab::impl_*,_false> + 0x52) == '\x01') {
    std::__cxx11::string::string(local_68,(string *)&this->tokenizer->escaped_space);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>(local_68," ",(allocator<char> *)&local_48);
  }
  _Var4.super__Head_base<0UL,_llama_vocab::impl_*,_false>._M_head_impl =
       (this->vocab->pimpl)._M_t.
       super___uniq_ptr_impl<llama_vocab::impl,_std::default_delete<llama_vocab::impl>_>._M_t.
       super__Tuple_impl<0UL,_llama_vocab::impl_*,_std::default_delete<llama_vocab::impl>_>.
       super__Head_base<0UL,_llama_vocab::impl_*,_false>;
  bVar1 = *(byte *)((long)_Var4.super__Head_base<0UL,_llama_vocab::impl_*,_false>._M_head_impl +
                   0x53);
  bVar2 = *(byte *)((long)_Var4.super__Head_base<0UL,_llama_vocab::impl_*,_false>._M_head_impl +
                   0x4c);
  bVar3 = *(byte *)((long)_Var4.super__Head_base<0UL,_llama_vocab::impl_*,_false>._M_head_impl +
                   0x51);
  uVar5 = input->_M_string_length;
  bVar8 = 0;
  bVar6 = false;
  for (input_offset = 0; input_offset < uVar5; input_offset = input_offset + local_48.consumed_input
      ) {
    normalize_prefix(&local_48,this,input,input_offset);
    for (uVar9 = 0; uVar9 < local_48.normalized_len; uVar9 = uVar9 + 1) {
      if (local_48.normalized[uVar9] == ' ') {
        if (bVar6) {
          bVar6 = false;
        }
        if (bVar3 == 0) {
          std::__cxx11::string::append((string *)normalized);
        }
      }
      else {
        if (!bVar6) {
          bVar7 = bVar3;
          if (((bVar1 ^ 1) & bVar2) != 0) {
            bVar7 = (~bVar8 | bVar3) & 1;
          }
          bVar6 = true;
          if (bVar7 != 0) {
            bVar8 = 1;
            std::__cxx11::string::append((string *)normalized);
            bVar6 = true;
          }
        }
        std::__cxx11::string::push_back((char)normalized);
      }
    }
  }
  if ((bVar1 & bVar2) != 0) {
    std::__cxx11::string::append((string *)normalized);
  }
  std::__cxx11::string::~string(local_68);
  return;
}

Assistant:

void normalize(const std::string& input, std::string * normalized) {
        normalized->clear();
        normalized->reserve(input.size() * 3);

        const std::string space = vocab.get_escape_whitespaces() ? tokenizer.escaped_space : " ";

        const bool shall_prepend_space = !vocab.get_treat_whitespace_as_suffix() && vocab.get_add_space_prefix();
        const bool shall_append_space  =  vocab.get_treat_whitespace_as_suffix() && vocab.get_add_space_prefix();
        const bool shall_merge_spaces  =  vocab.get_remove_extra_whitespaces();

        bool is_space_prepended = false;
        bool processing_non_ws = false;

        size_t input_len = input.size();

        for (size_t input_offset = 0; input_offset < input_len; ) {
            auto norm_res = normalize_prefix(input, input_offset);
            for (size_t i = 0; i < norm_res.normalized_len; i++) {
                char c = norm_res.normalized[i];
                if (c != ' ') {
                    if (!processing_non_ws) {
                        processing_non_ws = true;
                        if ((shall_prepend_space && !is_space_prepended) || shall_merge_spaces) {
                            normalized->append(space);
                            is_space_prepended = true;
                        }
                    }
                    normalized->push_back(c);
                } else {
                    if (processing_non_ws) {
                        processing_non_ws = false;
                    }
                    if (!shall_merge_spaces) {
                        normalized->append(space);
                    }
                }
            }

            input_offset += norm_res.consumed_input;
        }

        if (shall_append_space) {
            normalized->append(space);
        }
    }